

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O1

void __thiscall flow::lang::WhileStmt::~WhileStmt(WhileStmt *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Stmt *pSVar2;
  Expr *pEVar3;
  pointer pcVar4;
  
  (this->super_Stmt).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__WhileStmt_0019dc90;
  pSVar2 = (this->bodyStmt_)._M_t.
           super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
           super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
  if (pSVar2 != (Stmt *)0x0) {
    (**(code **)((long)(pSVar2->super_ASTNode)._vptr_ASTNode + 8))();
  }
  (this->bodyStmt_)._M_t.
  super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
  super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
  super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl = (Stmt *)0x0;
  pEVar3 = (this->cond_)._M_t.
           super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
           super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
  if (pEVar3 != (Expr *)0x0) {
    (**(code **)((long)(pEVar3->super_ASTNode)._vptr_ASTNode + 8))();
  }
  (this->cond_)._M_t.super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
  ._M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
  super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->super_Stmt).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_0019d690;
  pcVar4 = (this->super_Stmt).super_ASTNode.location_.filename._M_dataplus._M_p;
  paVar1 = &(this->super_Stmt).super_ASTNode.location_.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x50);
  return;
}

Assistant:

WhileStmt(SourceLocation loc, std::unique_ptr<Expr> cond, std::unique_ptr<Stmt> bodyStmt)
      : Stmt{std::move(loc)},
        cond_{std::move(cond)},
        bodyStmt_{std::move(bodyStmt)} {}